

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void print_name(flatcc_json_printer_t *ctx,char *name,size_t len)

{
  char *pcVar1;
  ulong __n;
  char *pcVar2;
  size_t sVar3;
  
  pcVar2 = ctx->p;
  if (ctx->indent == '\0') {
    if (ctx->pflush <= pcVar2) {
      (*ctx->flush)(ctx,0);
      pcVar2 = ctx->p;
    }
  }
  else {
    ctx->p = pcVar2 + 1;
    *pcVar2 = '\n';
    __n = (ulong)ctx->indent * (long)ctx->level;
    pcVar2 = ctx->pflush;
    pcVar1 = ctx->p;
    if (pcVar2 < pcVar1 + __n) {
      if (pcVar2 <= pcVar1) {
        (*ctx->flush)(ctx,0);
        pcVar2 = ctx->pflush;
        pcVar1 = ctx->p;
      }
      sVar3 = (long)pcVar2 - (long)pcVar1;
      if (sVar3 < __n) {
        do {
          memset(pcVar1,0x20,sVar3);
          ctx->p = ctx->p + sVar3;
          __n = __n - sVar3;
          (*ctx->flush)(ctx,0);
          pcVar1 = ctx->p;
          sVar3 = (long)ctx->pflush - (long)pcVar1;
        } while (sVar3 < __n);
      }
    }
    memset(pcVar1,0x20,__n);
    pcVar2 = ctx->p + __n;
    ctx->p = pcVar2;
  }
  *pcVar2 = '\"';
  pcVar1 = ctx->p + (ctx->unquote == '\0');
  pcVar2 = ctx->pflush;
  ctx->p = pcVar1;
  if (pcVar2 <= pcVar1 + len) {
    if (pcVar2 <= pcVar1) {
      (*ctx->flush)(ctx,0);
      pcVar2 = ctx->pflush;
      pcVar1 = ctx->p;
    }
    sVar3 = (long)pcVar2 - (long)pcVar1;
    if (sVar3 < len) {
      do {
        memcpy(pcVar1,name,sVar3);
        ctx->p = ctx->p + sVar3;
        name = name + sVar3;
        len = len - sVar3;
        (*ctx->flush)(ctx,0);
        pcVar1 = ctx->p;
        sVar3 = (long)ctx->pflush - (long)pcVar1;
      } while (sVar3 < len);
    }
  }
  memcpy(pcVar1,name,len);
  pcVar2 = ctx->p;
  ctx->p = pcVar2 + len;
  pcVar2[len] = '\"';
  pcVar2 = ctx->p;
  ctx->p = pcVar2 + (ctx->unquote == '\0') + 1;
  pcVar2[ctx->unquote == '\0'] = ':';
  *ctx->p = ' ';
  ctx->p = ctx->p + (ctx->indent != '\0');
  return;
}

Assistant:

static inline void print_name(flatcc_json_printer_t *ctx, const char *name, size_t len)
{
    print_nl();
    print_symbol(ctx, name, len);
    print_char(':');
    print_space();
}